

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

int __thiscall
CConsole::RegisterPrintCallback
          (CConsole *this,int OutputLevel,FPrintCallback pfnPrintCallback,void *pUserData)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0xc0) == 4) {
    local_4 = -1;
  }
  else {
    iVar1 = clamp<int>(in_ESI,0,2);
    *(int *)(in_RDI + 0x60 + (long)*(int *)(in_RDI + 0xc0) * 0x18) = iVar1;
    *(undefined8 *)(in_RDI + (long)*(int *)(in_RDI + 0xc0) * 0x18 + 0x68) = in_RDX;
    *(undefined8 *)(in_RDI + (long)*(int *)(in_RDI + 0xc0) * 0x18 + 0x70) = in_RCX;
    local_4 = *(int *)(in_RDI + 0xc0);
    *(int *)(in_RDI + 0xc0) = local_4 + 1;
  }
  return local_4;
}

Assistant:

int CConsole::RegisterPrintCallback(int OutputLevel, FPrintCallback pfnPrintCallback, void *pUserData)
{
	if(m_NumPrintCB == MAX_PRINT_CB)
		return -1;

	m_aPrintCB[m_NumPrintCB].m_OutputLevel = clamp(OutputLevel, (int)(OUTPUT_LEVEL_STANDARD), (int)(OUTPUT_LEVEL_DEBUG));
	m_aPrintCB[m_NumPrintCB].m_pfnPrintCallback = pfnPrintCallback;
	m_aPrintCB[m_NumPrintCB].m_pPrintCallbackUserdata = pUserData;
	return m_NumPrintCB++;
}